

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CumulativeReporterBase::~CumulativeReporterBase(CumulativeReporterBase *this)

{
  SectionNode *pSVar1;
  IConfig *pIVar2;
  
  (this->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__CumulativeReporterBase_001b6ab0;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::~vector(&this->m_sectionStack);
  pSVar1 = (this->m_deepestSection).m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  pSVar1 = (this->m_rootSection).m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>
  ::~vector(&this->m_testRuns);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ::~vector(&this->m_testGroups);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::~vector(&this->m_testCases);
  std::
  vector<std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ::~vector(&this->m_sections);
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::~vector
            (&this->m_assertions);
  pIVar2 = (this->m_config).m_p;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

CumulativeReporterBase::~CumulativeReporterBase() {}